

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

ui32 __thiscall mvm::test::test_instr_set::zero(test_instr_set *this)

{
  iterator __position;
  uint in_EAX;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  __position._M_current =
       (this->call_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->call_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->call_stack,__position,(uint *)((long)&uStack_8 + 4));
  }
  else {
    *__position._M_current = 0;
    (this->call_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return 0;
}

Assistant:

ui32 zero() {
    call_stack.push_back(0);
    return 0;
  }